

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesPowerGetProperties(zes_pwr_handle_t hPower,zes_power_properties_t *pProperties)

{
  zes_pfnPowerGetProperties_t pfnGetProperties;
  ze_result_t result;
  zes_power_properties_t *pProperties_local;
  zes_pwr_handle_t hPower_local;
  
  pfnGetProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cbd0 != (code *)0x0) {
    pfnGetProperties._4_4_ = (*DAT_0011cbd0)(hPower,pProperties);
  }
  return pfnGetProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPowerGetProperties(
        zes_pwr_handle_t hPower,                        ///< [in] Handle for the component.
        zes_power_properties_t* pProperties             ///< [in,out] Structure that will contain property data.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetProperties = context.zesDdiTable.Power.pfnGetProperties;
        if( nullptr != pfnGetProperties )
        {
            result = pfnGetProperties( hPower, pProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }